

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  unsigned_short *puVar1;
  double f;
  long i;
  long lVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  uVar4 = l->tt_ & 0xf;
  if (uVar4 == 4) {
    if ((r->tt_ & 0xfU) != 4) goto LAB_00111640;
    iVar3 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
    bVar7 = false;
    bVar6 = iVar3 < 0;
    bVar5 = iVar3 == 0;
  }
  else {
    if ((uVar4 != 3) || (uVar4 = r->tt_, (uVar4 & 0xf) != 3)) {
LAB_00111640:
      iVar3 = luaT_callorderTM(L,l,r,TM_LE);
      if (-1 < iVar3) {
        return iVar3;
      }
      puVar1 = &L->ci->callstatus;
      *puVar1 = *puVar1 | 0x80;
      iVar3 = luaT_callorderTM(L,r,l,TM_LT);
      puVar1 = &L->ci->callstatus;
      *puVar1 = *puVar1 ^ 0x80;
      if (-1 < iVar3) {
        return (uint)(iVar3 == 0);
      }
      luaG_ordererror(L,l,r);
    }
    if (l->tt_ != 0x13) {
      f = (l->value_).n;
      if (uVar4 == 3) {
        return (uint)(f <= (r->value_).n);
      }
      if (!NAN(f)) {
        uVar4 = LTintfloat((r->value_).i,f);
        return uVar4 ^ 1;
      }
      return 0;
    }
    i = (l->value_).i;
    if (uVar4 != 0x13) {
      iVar3 = LEintfloat(i,(r->value_).n);
      return iVar3;
    }
    lVar2 = (r->value_).i;
    bVar7 = SBORROW8(i,lVar2);
    bVar6 = i - lVar2 < 0;
    bVar5 = i == lVar2;
  }
  return (uint)(bVar5 || bVar7 != bVar6);
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LEnum(l, r);
  else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
    return l_strcmp(tsvalue(l), tsvalue(r)) <= 0;
  else if ((res = luaT_callorderTM(L, l, r, TM_LE)) >= 0)  /* try 'le' */
    return res;
  else {  /* try 'lt': */
    L->ci->callstatus |= CIST_LEQ;  /* mark it is doing 'lt' for 'le' */
    res = luaT_callorderTM(L, r, l, TM_LT);
    L->ci->callstatus ^= CIST_LEQ;  /* clear mark */
    if (res < 0)
      luaG_ordererror(L, l, r);
    return !res;  /* result is negated */
  }
}